

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O2

void __thiscall UdpSocketTest::test2(UdpSocketTest *this)

{
  int i;
  uint uVar1;
  int iVar2;
  long lVar3;
  Address server_addr2;
  char buf [128];
  Socket sock;
  Address sock_addr;
  Address server_addr;
  ServerSocket server2;
  Address test_addr;
  ServerSocket server;
  
  JetHead::ServerSocket::ServerSocket(&server,false);
  JetHead::ServerSocket::ServerSocket(&server2,false);
  server_addr2.mLen = 0x10;
  server_addr2.mAddr.sin_family = 2;
  server_addr2.mAddr.sin_port = 0;
  server_addr2.mAddr.sin_addr.s_addr = 0;
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    buf[lVar3] = 'A';
  }
  uVar1 = JetHead::Socket::write(&server,(int)buf);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x87,"Writing to an unconnected socket should be an error: %d.",(ulong)uVar1);
  }
  uVar1 = JetHead::Socket::write(&server,(int)buf);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x8a,"Writing to an unconnected socket should be an error: %d.",(ulong)uVar1);
  }
  JetHead::ServerSocket::bind((Address *)&server);
  iVar2 = JetHead::ServerSocket::bind((Address *)&server2);
  if (iVar2 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x94,"Bind Failed");
  }
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    buf[lVar3] = 'B';
  }
  uVar1 = JetHead::Socket::write(&server2,(int)buf);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x9c,"Writing to a socket before it has an address should be an \t\t erro: %d ",
               (ulong)uVar1);
  }
  JetHead::Socket::getLocalAddress((Address *)&server2);
  JetHead::Socket::Address::setAddress((char *)&server_addr2);
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    buf[lVar3] = 'C';
  }
  uVar1 = JetHead::Socket::write(&server2,(int)buf);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xa7,"Writing to a non-connected socket should be an error: %d.",(ulong)uVar1);
  }
  JetHead::Socket::Socket(&sock,false);
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    buf[lVar3] = 'D';
  }
  uVar1 = JetHead::Socket::write(&sock,(int)buf);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xb4,"Writing to an unconnected socket should be an error: %d.",(ulong)uVar1);
  }
  JetHead::Socket::Address::Address(&test_addr,"127.0.0.1",0x1771);
  uVar1 = JetHead::Socket::connect((Address *)&sock);
  if ((int)uVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xb9,"Connect failed %d.",(ulong)uVar1);
  }
  JetHead::Socket::getLocalAddress((Address *)&sock);
  uVar1 = JetHead::Socket::write(&sock,(int)buf);
  if ((int)uVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xc0,"Write failed %d.",(ulong)uVar1);
  }
  uVar1 = JetHead::Socket::read(&sock,(int)buf);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,199,"reading from a socket that is connected to nothing should fail %d.",
               (ulong)uVar1);
  }
  uVar1 = JetHead::Socket::close();
  if ((int)uVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xcb,"Close failed: %d.",(ulong)uVar1);
  }
  uVar1 = JetHead::Socket::write(&sock,(int)buf);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xcf,"Writing to a closed socket should be an error: %d.",(ulong)uVar1);
  }
  uVar1 = JetHead::Socket::write(&sock,(int)buf);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xd3,"Writing to a closed socket should be an error: %d.",(ulong)uVar1);
  }
  JetHead::Socket::~Socket(&sock);
  JetHead::ServerSocket::~ServerSocket(&server2);
  JetHead::ServerSocket::~ServerSocket(&server);
  return;
}

Assistant:

void UdpSocketTest::test2()
{
 
  ServerSocket server(false), server2(false);
  Socket::Address server_addr, server_addr2;
  int res;

  char buf[128];
  for (int i = 0; i < 128; i++)
    buf[i] = 'A';

  res = server.write(buf, 128);
  if( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);
  res = server.write(buf, 128);
  if( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);

  // This fails...
  res = server.bind(server_addr);
  //if ( res < 0 )
  //TestFailed( "Bind Failed" );


   res = server2.bind(server_addr2);
   if ( res < 0 )
     TestFailed( "Bind Failed" );

   for (int i = 0; i < 128; i++)
     buf[i] = 'B';

   res = server2.write(buf, 128);
   if( res != -1 )
     TestFailed("Writing to a socket before it has an address should be an \
		 erro: %d ", res);

  server2.getLocalAddress( server_addr2 );  
  server_addr2.setAddress( "127.0.0.1" );
  //cerr << "Server name " << server_addr2.getName() << " " << server_addr2.getPort()  << endl;

  for (int i = 0; i < 128; i++)
    buf[i] = 'C';

  res = server2.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a non-connected socket should be an error: %d.", res);



  // Create a socket: write before being connected, connect, write, read.
  Socket sock(false);
  Socket::Address sock_addr;
  for (int i = 0; i < 128; i++)
    buf[i] = 'D';


  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);

  Socket::Address test_addr("127.0.0.1", 6001);
  res = sock.connect(test_addr);
  if( res < 0 )
    TestFailed("Connect failed %d.", res);

  sock.getLocalAddress( sock_addr );
  //cerr << "Sock name " << sock_addr.getName() << " " << sock_addr.getPort()  << endl;
  
  res = sock.write(buf, 128);
  if( res < 0 )
    TestFailed("Write failed %d.", res);


  // This will fail unless there is an other socket connected to this one
  // nc -u -p 6001 127.0.0.1 <sock_addr.getPort()>
  res = sock.read(buf, 128);
  if( res != -1)
    TestFailed("reading from a socket that is connected to nothing should fail %d.", res);

  res = sock.close();
  if( res < 0 )
    TestFailed("Close failed: %d.", res);
  
  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a closed socket should be an error: %d.", res);
  
  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a closed socket should be an error: %d.", res);
 
}